

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RegisterLikeFunctions(sqlite3 *db,int caseSensitive)

{
  FuncDef *pFVar1;
  uint local_24;
  compareInfo *pcStack_20;
  int flags;
  compareInfo *pInfo;
  int caseSensitive_local;
  sqlite3 *db_local;
  
  if (caseSensitive == 0) {
    pcStack_20 = &likeInfoNorm;
    local_24 = 4;
  }
  else {
    pcStack_20 = &likeInfoAlt;
    local_24 = 0xc;
  }
  sqlite3CreateFunc(db,"like",2,1,pcStack_20,likeFunc,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (FuncDestructor *)0x0);
  sqlite3CreateFunc(db,"like",3,1,pcStack_20,likeFunc,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                    (FuncDestructor *)0x0);
  pFVar1 = sqlite3FindFunction(db,"like",2,'\x01','\0');
  pFVar1->funcFlags = local_24 | pFVar1->funcFlags;
  pFVar1 = sqlite3FindFunction(db,"like",3,'\x01','\0');
  pFVar1->funcFlags = local_24 | pFVar1->funcFlags;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RegisterLikeFunctions(sqlite3 *db, int caseSensitive){
  struct compareInfo *pInfo;
  int flags;
  if( caseSensitive ){
    pInfo = (struct compareInfo*)&likeInfoAlt;
    flags = SQLITE_FUNC_LIKE | SQLITE_FUNC_CASE;
  }else{
    pInfo = (struct compareInfo*)&likeInfoNorm;
    flags = SQLITE_FUNC_LIKE;
  }
  sqlite3CreateFunc(db, "like", 2, SQLITE_UTF8, pInfo, likeFunc, 0, 0, 0, 0, 0);
  sqlite3CreateFunc(db, "like", 3, SQLITE_UTF8, pInfo, likeFunc, 0, 0, 0, 0, 0);
  sqlite3FindFunction(db, "like", 2, SQLITE_UTF8, 0)->funcFlags |= flags;
  sqlite3FindFunction(db, "like", 3, SQLITE_UTF8, 0)->funcFlags |= flags;
}